

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall Address_PegoutAddressTest_Test::TestBody(Address_PegoutAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference network_parameter;
  AssertHelper local_408;
  Message local_400;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_3b0 [8];
  Address addr2;
  Message local_230;
  string local_228;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  Address addr1;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  Script pegout_script;
  Address_PegoutAddressTest_Test *this_local;
  
  pegout_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_69);
  cfd::core::Script::Script((Script *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  cfd::core::Address::GetPegoutAddress
            ((Address *)&gtest_ar.message_,kCfdIllegalStateError,(Script *)local_48);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_228,(Address *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
            ((EqHelper<false> *)local_208,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",
             "addr1.GetAddress()",(char (*) [36])"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x404,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_230)
    ;
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  cfd::core::GetBitcoinAddressFormatList();
  network_parameter =
       std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
       operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)&gtest_ar_1.message_,0);
  cfd::core::Address::GetPegoutAddress
            ((Address *)local_3b0,kCfdSuccess,(Script *)local_48,network_parameter);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_3f8,(Address *)local_3b0);
  testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
            ((EqHelper<false> *)local_3d8,"\"3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13\"",
             "addr2.GetAddress()",(char (*) [35])"3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13",&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x408,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  cfd::core::Address::~Address((Address *)local_3b0);
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(Address, PegoutAddressTest) {
  Script pegout_script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066");
  Address addr1 = Address::GetPegoutAddress(NetType::kRegtest, pegout_script);
  EXPECT_EQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", addr1.GetAddress());

  Address addr2 = Address::GetPegoutAddress(NetType::kMainnet, pegout_script,
      GetBitcoinAddressFormatList()[0]);
  EXPECT_EQ("3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13", addr2.GetAddress());
}